

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_GetOwnPropertyNamesInternal
              (JSContext *ctx,JSPropertyEnum **ptab,uint32_t *plen,JSObject *p,int flags)

{
  uint v;
  JSAtomStruct *pJVar1;
  JSClassExoticMethods *pJVar2;
  _func_int_JSContext_ptr_JSPropertyEnum_ptr_ptr_uint32_t_ptr_JSValue *p_Var3;
  JSPropertyEnum *pJVar4;
  JSAtomKindEnum JVar5;
  BOOL BVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  JSAtom JVar12;
  JSShape *pJVar13;
  uint32_t uVar14;
  uint uVar15;
  ulong uVar16;
  JSContext *pJVar17;
  int iVar18;
  JSObject *p_2;
  long lVar19;
  JSValueUnion JVar20;
  bool bVar21;
  JSValue JVar22;
  uint32_t exotic_count;
  JSPropertyEnum *tab_exotic;
  JSObject *p_1;
  uint32_t num_key;
  JSPropertyDescriptor desc;
  uint local_c8;
  uint32_t local_c4;
  JSContext *local_c0;
  ulong local_b8;
  JSShape *local_b0;
  JSPropertyEnum *local_a8;
  JSValueUnion local_a0;
  int local_94;
  JSPropertyEnum *local_90;
  uint32_t local_84;
  ulong local_80;
  JSPropertyEnum **local_78;
  uint32_t *local_70;
  JSPropertyDescriptor local_68;
  
  *ptab = (JSPropertyEnum *)0x0;
  *plen = 0;
  local_c4 = 0;
  local_a8 = (JSPropertyEnum *)0x0;
  pJVar13 = p->shape;
  uVar16 = (ulong)local_b0 >> 0x20;
  local_b0 = (JSShape *)(uVar16 << 0x20);
  local_b8 = 0;
  local_c8 = 0;
  local_c0 = ctx;
  local_a0 = (JSValueUnion)p;
  local_78 = ptab;
  local_70 = plen;
  if (0 < pJVar13->prop_count) {
    lVar19 = 0;
    local_c8 = 0;
    local_b8 = 0;
    local_b0 = (JSShape *)(uVar16 << 0x20);
    do {
      JVar12 = *(JSAtom *)(&pJVar13[1].header.field_0x4 + lVar19 * 8);
      if (JVar12 != 0) {
        uVar7 = (&pJVar13[1].header.ref_count)[lVar19 * 2];
        JVar5 = JS_AtomGetKind(local_c0,JVar12);
        if ((((flags & 0x10U) == 0) || ((uVar7 & 0x10000000) != 0)) &&
           (((uint)flags >> (JVar5 & 0x1f) & 1) != 0)) {
          BVar6 = JS_AtomIsArrayIndex(local_c0,&local_84,JVar12);
          if (BVar6 == 0) {
            if (JVar5 == JS_ATOM_KIND_STRING) {
              local_b8 = (ulong)((int)local_b8 + 1);
            }
            else {
              local_b0 = (JSShape *)CONCAT44(local_b0._4_4_,(int)local_b0 + 1);
            }
          }
          else {
            local_c8 = local_c8 + 1;
          }
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < pJVar13->prop_count);
  }
  JVar20 = local_a0;
  pJVar17 = local_c0;
  if ((*(byte *)((long)local_a0.ptr + 5) & 4) == 0) {
    iVar18 = 0;
  }
  else if ((*(byte *)((long)local_a0.ptr + 5) & 8) == 0) {
    if ((ulong)*(ushort *)((long)local_a0.ptr + 6) == 5) {
      if ((flags & 1U) == 0) {
        iVar18 = 0;
      }
      else {
        iVar18 = 0;
        uVar7 = 0;
        if (*(int *)((long)local_a0.ptr + 0x38) == -7) {
          uVar7 = *(uint *)&(((anon_union_24_22_bbf4f0e3_for_u *)((long)local_a0.ptr + 0x30))->
                             async_function_data->header).field_0x4 & 0x7fffffff;
        }
        local_c8 = local_c8 + uVar7;
      }
    }
    else {
      pJVar2 = local_c0->rt->class_array[*(ushort *)((long)local_a0.ptr + 6)].exotic;
      bVar21 = true;
      iVar18 = 0;
      if ((pJVar2 != (JSClassExoticMethods *)0x0) &&
         (p_Var3 = pJVar2->get_own_property_names, iVar18 = 0,
         p_Var3 != (_func_int_JSContext_ptr_JSPropertyEnum_ptr_ptr_uint32_t_ptr_JSValue *)0x0)) {
        JVar22.tag = -1;
        JVar22.u.ptr = local_a0.ptr;
        iVar10 = (*p_Var3)(local_c0,&local_a8,&local_c4,JVar22);
        iVar18 = 0;
        if (iVar10 == 0) {
          if (local_c4 != 0) {
            uVar16 = 0;
            iVar18 = 0;
            do {
              JVar12 = local_a8[uVar16].atom;
              JVar5 = JS_AtomGetKind(pJVar17,JVar12);
              if (((uint)flags >> (JVar5 & 0x1f) & 1) != 0) {
                if ((flags & 0x30U) == 0) {
                  uVar7 = 0;
                }
                else {
                  iVar10 = JS_GetOwnPropertyInternal
                                     (pJVar17,&local_68,(JSObject *)local_a0.ptr,JVar12);
                  if (iVar10 < 0) {
                    js_free_prop_enum(pJVar17,local_a8,local_c4);
                    uVar7 = 0;
                  }
                  else {
                    if (iVar10 == 0) {
                      uVar7 = 0;
                    }
                    else {
                      uVar7 = (uint)local_68.flags >> 2 & 1;
                      js_free_desc(pJVar17,&local_68);
                    }
                    local_a8[uVar16].is_enumerable = uVar7;
                  }
                  if (iVar10 < 0) {
                    bVar21 = false;
                    JVar20 = local_a0;
                    break;
                  }
                }
                iVar18 = iVar18 + (uint)(uVar7 != 0 || (flags & 0x10U) == 0);
              }
              uVar16 = uVar16 + 1;
              JVar20 = local_a0;
            } while (uVar16 < local_c4);
          }
        }
        else {
          bVar21 = false;
        }
      }
      if (!bVar21) {
        return -1;
      }
    }
  }
  else {
    iVar18 = 0;
    if ((flags & 1U) != 0) {
      local_c8 = local_c8 + *(int *)((long)local_a0.ptr + 0x40);
    }
  }
  uVar7 = (int)local_b8 + local_c8;
  local_b8 = (ulong)uVar7;
  uVar14 = iVar18 + (int)local_b0 + uVar7;
  uVar16 = 1;
  if (1 < (int)uVar14) {
    uVar16 = (ulong)uVar14;
  }
  local_90 = (JSPropertyEnum *)js_malloc(pJVar17,uVar16 << 3);
  if (local_90 == (JSPropertyEnum *)0x0) {
    js_free_prop_enum(pJVar17,local_a8,local_c4);
    return -1;
  }
  pJVar13 = *(JSShape **)((long)JVar20.ptr + 0x18);
  if (pJVar13->prop_count < 1) {
    bVar21 = true;
    uVar7 = 0;
  }
  else {
    lVar19 = 0;
    local_94 = 1;
    uVar7 = 0;
    local_b0 = pJVar13;
    local_80 = (ulong)uVar14;
    uVar9 = local_c8;
    do {
      v = *(uint *)(&pJVar13[1].header.field_0x4 + lVar19 * 8);
      if ((ulong)v != 0) {
        uVar15 = (&pJVar13[1].header.ref_count)[lVar19 * 2] & 0x10000000;
        JVar5 = JS_AtomGetKind(pJVar17,v);
        pJVar17 = local_c0;
        pJVar13 = local_b0;
        if ((((flags & 0x10U) == 0) || (uVar15 != 0)) && (((uint)flags >> (JVar5 & 0x1f) & 1) != 0))
        {
          BVar6 = JS_AtomIsArrayIndex(local_c0,&local_84,v);
          uVar8 = uVar9;
          if (BVar6 == 0) {
            uVar11 = uVar7;
            if (JVar5 == JS_ATOM_KIND_STRING) {
              uVar8 = uVar9 + 1;
              uVar7 = uVar9;
            }
            else {
              uVar7 = (uint)local_b8;
              local_b8 = (ulong)(uVar7 + 1);
            }
          }
          else {
            local_94 = 0;
            uVar11 = uVar7 + 1;
          }
          if (0xd1 < (int)v) {
            pJVar1 = local_c0->rt->atom_array[v];
            (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
          }
          local_90[(int)uVar7].atom = v;
          local_90[(int)uVar7].is_enumerable = uVar15 >> 0x1c;
          local_b8 = local_b8 & 0xffffffff;
          pJVar13 = local_b0;
          pJVar17 = local_c0;
          uVar7 = uVar11;
          uVar9 = uVar8;
        }
      }
      lVar19 = lVar19 + 1;
    } while ((int)lVar19 < pJVar13->prop_count);
    bVar21 = local_94 != 0;
    uVar14 = (uint32_t)local_80;
    JVar20 = local_a0;
  }
  if ((*(byte *)((long)JVar20.ptr + 5) & 4) == 0) goto LAB_0011ee2b;
  if ((*(byte *)((long)JVar20.ptr + 5) & 8) == 0) {
    if (*(short *)((long)JVar20.ptr + 6) != 5) {
      if (local_c4 != 0) {
        uVar16 = 0;
        do {
          iVar18 = local_a8[uVar16].is_enumerable;
          JVar12 = local_a8[uVar16].atom;
          JVar5 = JS_AtomGetKind(pJVar17,JVar12);
          if ((((flags & 0x10U) == 0) || (iVar18 != 0)) &&
             (((uint)flags >> (JVar5 & 0x1f) & 1) != 0)) {
            local_90[local_b8 & 0xffffffff].atom = JVar12;
            local_90[local_b8 & 0xffffffff].is_enumerable = iVar18;
            local_b8 = (ulong)((int)local_b8 + 1);
          }
          else {
            JS_FreeAtom(pJVar17,JVar12);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < local_c4);
      }
      (*(pJVar17->rt->mf).js_free)(&pJVar17->rt->malloc_state,local_a8);
      goto LAB_0011ee2b;
    }
    if ((flags & 1U) == 0) goto LAB_0011ee2b;
    uVar9 = 0;
    if (*(int *)((long)JVar20.ptr + 0x38) == -7) {
      uVar9 = *(uint *)&(((anon_union_24_22_bbf4f0e3_for_u *)((long)JVar20.ptr + 0x30))->
                         async_function_data->header).field_0x4 & 0x7fffffff;
    }
  }
  else {
    if ((flags & 1U) == 0) goto LAB_0011ee2b;
    uVar9 = *(uint *)((long)JVar20.ptr + 0x40);
  }
  if (0 < (int)uVar9) {
    JVar12 = 0x80000000;
    do {
      local_90[uVar7].atom = JVar12;
      local_90[uVar7].is_enumerable = 1;
      uVar7 = uVar7 + 1;
      JVar12 = JVar12 + 1;
    } while( true );
  }
LAB_0011ee2b:
  pJVar4 = local_90;
  if (!(bool)(local_c8 == 0 | bVar21)) {
    rqsort(local_90,(ulong)local_c8,8,num_keys_cmp,pJVar17);
  }
  *local_78 = pJVar4;
  *local_70 = uVar14;
  return 0;
}

Assistant:

static int __exception JS_GetOwnPropertyNamesInternal(JSContext *ctx,
                                                      JSPropertyEnum **ptab,
                                                      uint32_t *plen,
                                                      JSObject *p, int flags)
{
    int i, j;
    JSShape *sh;
    JSShapeProperty *prs;
    JSPropertyEnum *tab_atom, *tab_exotic;
    JSAtom atom;
    uint32_t num_keys_count, str_keys_count, sym_keys_count, atom_count;
    uint32_t num_index, str_index, sym_index, exotic_count, exotic_keys_count;
    BOOL is_enumerable, num_sorted;
    uint32_t num_key;
    JSAtomKindEnum kind;
    
    /* clear pointer for consistency in case of failure */
    *ptab = NULL;
    *plen = 0;

    /* compute the number of returned properties */
    num_keys_count = 0;
    str_keys_count = 0;
    sym_keys_count = 0;
    exotic_keys_count = 0;
    exotic_count = 0;
    tab_exotic = NULL;
    sh = p->shape;
    for(i = 0, prs = get_shape_prop(sh); i < sh->prop_count; i++, prs++) {
        atom = prs->atom;
        if (atom != JS_ATOM_NULL) {
            is_enumerable = ((prs->flags & JS_PROP_ENUMERABLE) != 0);
            kind = JS_AtomGetKind(ctx, atom);
            if ((!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) &&
                ((flags >> kind) & 1) != 0) {
                /* need to raise an exception in case of the module
                   name space (implicit GetOwnProperty) */
                if (unlikely((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) &&
                    (flags & (JS_GPN_SET_ENUM | JS_GPN_ENUM_ONLY))) {
                    JSVarRef *var_ref = p->prop[i].u.var_ref;
                    if (unlikely(JS_IsUninitialized(*var_ref->pvalue))) {
                        JS_ThrowReferenceErrorUninitialized(ctx, prs->atom);
                        return -1;
                    }
                }
                if (JS_AtomIsArrayIndex(ctx, &num_key, atom)) {
                    num_keys_count++;
                } else if (kind == JS_ATOM_KIND_STRING) {
                    str_keys_count++;
                } else {
                    sym_keys_count++;
                }
            }
        }
    }

    if (p->is_exotic) {
        if (p->fast_array) {
            if (flags & JS_GPN_STRING_MASK) {
                num_keys_count += p->u.array.count;
            }
        } else if (p->class_id == JS_CLASS_STRING) {
            if (flags & JS_GPN_STRING_MASK) {
                num_keys_count += js_string_obj_get_length(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
            }
        } else {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em && em->get_own_property_names) {
                if (em->get_own_property_names(ctx, &tab_exotic, &exotic_count,
                                               JS_MKPTR(JS_TAG_OBJECT, p)))
                    return -1;
                for(i = 0; i < exotic_count; i++) {
                    atom = tab_exotic[i].atom;
                    kind = JS_AtomGetKind(ctx, atom);
                    if (((flags >> kind) & 1) != 0) {
                        is_enumerable = FALSE;
                        if (flags & (JS_GPN_SET_ENUM | JS_GPN_ENUM_ONLY)) {
                            JSPropertyDescriptor desc;
                            int res;
                            /* set the "is_enumerable" field if necessary */
                            res = JS_GetOwnPropertyInternal(ctx, &desc, p, atom);
                            if (res < 0) {
                                js_free_prop_enum(ctx, tab_exotic, exotic_count);
                                return -1;
                            }
                            if (res) {
                                is_enumerable =
                                    ((desc.flags & JS_PROP_ENUMERABLE) != 0);
                                js_free_desc(ctx, &desc);
                            }
                            tab_exotic[i].is_enumerable = is_enumerable;
                        }
                        if (!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) {
                            exotic_keys_count++;
                        }
                    }
                }
            }
        }
    }

    /* fill them */

    atom_count = num_keys_count + str_keys_count + sym_keys_count + exotic_keys_count;
    /* avoid allocating 0 bytes */
    tab_atom = js_malloc(ctx, sizeof(tab_atom[0]) * max_int(atom_count, 1));
    if (!tab_atom) {
        js_free_prop_enum(ctx, tab_exotic, exotic_count);
        return -1;
    }

    num_index = 0;
    str_index = num_keys_count;
    sym_index = str_index + str_keys_count;

    num_sorted = TRUE;
    sh = p->shape;
    for(i = 0, prs = get_shape_prop(sh); i < sh->prop_count; i++, prs++) {
        atom = prs->atom;
        if (atom != JS_ATOM_NULL) {
            is_enumerable = ((prs->flags & JS_PROP_ENUMERABLE) != 0);
            kind = JS_AtomGetKind(ctx, atom);
            if ((!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) &&
                ((flags >> kind) & 1) != 0) {
                if (JS_AtomIsArrayIndex(ctx, &num_key, atom)) {
                    j = num_index++;
                    num_sorted = FALSE;
                } else if (kind == JS_ATOM_KIND_STRING) {
                    j = str_index++;
                } else {
                    j = sym_index++;
                }
                tab_atom[j].atom = JS_DupAtom(ctx, atom);
                tab_atom[j].is_enumerable = is_enumerable;
            }
        }
    }

    if (p->is_exotic) {
        int len;
        if (p->fast_array) {
            if (flags & JS_GPN_STRING_MASK) {
                len = p->u.array.count;
                goto add_array_keys;
            }
        } else if (p->class_id == JS_CLASS_STRING) {
            if (flags & JS_GPN_STRING_MASK) {
                len = js_string_obj_get_length(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
            add_array_keys:
                for(i = 0; i < len; i++) {
                    tab_atom[num_index].atom = __JS_AtomFromUInt32(i);
                    if (tab_atom[num_index].atom == JS_ATOM_NULL) {
                        js_free_prop_enum(ctx, tab_atom, num_index);
                        return -1;
                    }
                    tab_atom[num_index].is_enumerable = TRUE;
                    num_index++;
                }
            }
        } else {
            /* Note: exotic keys are not reordered and comes after the object own properties. */
            for(i = 0; i < exotic_count; i++) {
                atom = tab_exotic[i].atom;
                is_enumerable = tab_exotic[i].is_enumerable;
                kind = JS_AtomGetKind(ctx, atom);
                if ((!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) &&
                    ((flags >> kind) & 1) != 0) {
                    tab_atom[sym_index].atom = atom;
                    tab_atom[sym_index].is_enumerable = is_enumerable;
                    sym_index++;
                } else {
                    JS_FreeAtom(ctx, atom);
                }
            }
            js_free(ctx, tab_exotic);
        }
    }

    assert(num_index == num_keys_count);
    assert(str_index == num_keys_count + str_keys_count);
    assert(sym_index == atom_count);

    if (num_keys_count != 0 && !num_sorted) {
        rqsort(tab_atom, num_keys_count, sizeof(tab_atom[0]), num_keys_cmp,
               ctx);
    }
    *ptab = tab_atom;
    *plen = atom_count;
    return 0;
}